

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O0

int generate_by_miniscript_concat
              (miniscript_node_t *node,miniscript_node_t *parent,int32_t derive_child_num,
              size_t target_num,size_t *reference_indexes,uchar *prev_insert,size_t prev_insert_num,
              uchar *first_insert,size_t first_insert_num,uchar *second_insert,
              size_t second_insert_num,uchar *last_append,size_t last_append_num,uchar *script,
              size_t script_len,size_t *write_len)

{
  miniscript_node_t *local_c8;
  ulong local_c0;
  size_t check_len;
  size_t *indexes;
  size_t default_indexes [3];
  miniscript_node_t *local_88;
  miniscript_node_t *child [3];
  size_t local_68;
  size_t offset;
  size_t index;
  size_t total;
  size_t output_len;
  uchar *puStack_40;
  int ret;
  uchar *prev_insert_local;
  size_t *reference_indexes_local;
  size_t target_num_local;
  miniscript_node_t *pmStack_20;
  int32_t derive_child_num_local;
  miniscript_node_t *parent_local;
  miniscript_node_t *node_local;
  
  index = prev_insert_num + first_insert_num + second_insert_num;
  local_68 = 0;
  indexes = (size_t *)0x0;
  default_indexes[0] = 1;
  default_indexes[1] = 2;
  if (script_len < 0x208) {
    local_c0 = script_len;
  }
  else {
    local_c0 = 0x208;
  }
  if ((node->child == (miniscript_node_t *)0x0) ||
     ((parent != (miniscript_node_t *)0x0 && (parent->info == (miniscript_item_t *)0x0)))) {
    node_local._4_4_ = -2;
  }
  else {
    check_len = (size_t)reference_indexes;
    if (reference_indexes == (size_t *)0x0) {
      check_len = (size_t)&indexes;
    }
    puStack_40 = prev_insert;
    prev_insert_local = (uchar *)reference_indexes;
    reference_indexes_local = (size_t *)target_num;
    target_num_local._4_4_ = derive_child_num;
    pmStack_20 = parent;
    parent_local = node;
    wally_bzero(&local_88,0x18);
    for (offset = 0; offset < reference_indexes_local; offset = offset + 1) {
      if (offset == 0) {
        local_c8 = parent_local->child;
      }
      else {
        local_c8 = child[offset - 2]->next;
      }
      child[offset - 1] = local_c8;
      if (child[offset - 1] == (miniscript_node_t *)0x0) {
        return -2;
      }
    }
    for (offset = 0; offset < reference_indexes_local; offset = offset + 1) {
      if ((offset == 0) && (prev_insert_num != 0)) {
        memcpy(script + local_68,puStack_40,prev_insert_num);
        local_68 = prev_insert_num + local_68;
      }
      if ((offset == 1) && (first_insert_num != 0)) {
        memcpy(script + local_68,first_insert,first_insert_num);
        local_68 = first_insert_num + local_68;
      }
      if ((offset == 2) && (second_insert_num != 0)) {
        memcpy(script + local_68,second_insert,second_insert_num);
        local_68 = second_insert_num + local_68;
      }
      total = 0;
      output_len._4_4_ =
           generate_script_from_miniscript
                     (child[*(long *)(check_len + offset * 8) + -1],parent_local,
                      target_num_local._4_4_,script + local_68,(script_len - local_68) - 1,&total);
      if (output_len._4_4_ != 0) {
        return output_len._4_4_;
      }
      local_68 = total + local_68;
      index = total + index;
      if (local_c0 < index) {
        return -2;
      }
    }
    if (local_c0 < index + last_append_num) {
      node_local._4_4_ = -2;
    }
    else {
      if (last_append_num != 0) {
        memcpy(script + local_68,last_append,last_append_num);
        local_68 = last_append_num + local_68;
      }
      if (output_len._4_4_ == 0) {
        *write_len = local_68;
      }
      node_local._4_4_ = output_len._4_4_;
    }
  }
  return node_local._4_4_;
}

Assistant:

static int generate_by_miniscript_concat(
    struct miniscript_node_t *node,
    struct miniscript_node_t *parent,
    int32_t derive_child_num,
    size_t target_num,
    const size_t *reference_indexes,
    unsigned char *prev_insert,
    size_t prev_insert_num,
    unsigned char *first_insert,
    size_t first_insert_num,
    unsigned char *second_insert,
    size_t second_insert_num,
    unsigned char *last_append,
    size_t last_append_num,
    unsigned char *script,
    size_t script_len,
    size_t *write_len)
{
    int ret;
    size_t output_len;
    size_t total = prev_insert_num + first_insert_num + second_insert_num;
    size_t index = 0;
    size_t offset = 0;
    struct miniscript_node_t *child[3];
    size_t default_indexes[] = {0, 1, 2};
    const size_t *indexes = reference_indexes;
    size_t check_len = (DESCRIPTOR_REDEEM_SCRIPT_MAX_SIZE > script_len) ?
                       script_len : DESCRIPTOR_REDEEM_SCRIPT_MAX_SIZE;

    if (!node->child || (parent && !parent->info))
        return WALLY_EINVAL;

    if (!reference_indexes)
        indexes = default_indexes;

    wally_bzero(child, sizeof(child));

    for (index = 0; index < target_num; ++index) {
        child[index] = (index == 0) ? node->child : child[index - 1]->next;
        if (!child[index])
            return WALLY_EINVAL;
    }

    for (index = 0; index < target_num; ++index) {
        if ((index == 0) && prev_insert_num) {
            memcpy(script + offset, prev_insert, prev_insert_num);
            offset += prev_insert_num;
        }
        if ((index == 1) && first_insert_num) {
            memcpy(script + offset, first_insert, first_insert_num);
            offset += first_insert_num;
        }
        if ((index == 2) && second_insert_num) {
            memcpy(script + offset, second_insert, second_insert_num);
            offset += second_insert_num;
        }

        output_len = 0;
        ret = generate_script_from_miniscript(child[indexes[index]], node, derive_child_num,
                                              &script[offset], script_len - offset - 1,
                                              &output_len);
        if (ret != WALLY_OK)
            return ret;

        offset += output_len;
        total += output_len;
        if (total > check_len)
            return WALLY_EINVAL;
    }

    if (total + last_append_num > check_len)
        return WALLY_EINVAL;
    if (last_append_num) {
        memcpy(script + offset, last_append, last_append_num);
        offset += last_append_num;
    }

    if (ret == WALLY_OK)
        *write_len = offset;

    return ret;
}